

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O0

void __thiscall kratos::DebugInfoVisitor::visit(DebugInfoVisitor *this,FunctionStmtBlock *stmt)

{
  FunctionStmtBlock *stmt_local;
  DebugInfoVisitor *this_local;
  
  add_info(this,(Stmt *)stmt);
  return;
}

Assistant:

void inline visit(FunctionStmtBlock *stmt) override { add_info(stmt); }